

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_reader.c
# Opt level: O0

int dlep_reader_ipv4_conpoint_tlv
              (netaddr *addr,uint16_t *port,_Bool *tls,dlep_session *session,
              dlep_parser_value *value)

{
  uint16_t uVar1;
  byte *pbVar2;
  uint8_t *ptr;
  dlep_parser_value *pdStack_68;
  uint16_t tmp;
  dlep_parser_value *value_local;
  dlep_session *session_local;
  _Bool *tls_local;
  uint16_t *port_local;
  netaddr *addr_local;
  
  pdStack_68 = value;
  if ((value == (dlep_parser_value *)0x0) &&
     (pdStack_68 = dlep_session_get_tlv_value(session,2), pdStack_68 == (dlep_parser_value *)0x0)) {
    addr_local._4_4_ = -1;
  }
  else if ((pdStack_68->length == 5) || (pdStack_68->length == 7)) {
    pbVar2 = (session->parser).tlv_ptr + pdStack_68->index;
    *tls = (*pbVar2 & 1) == 1;
    if (pdStack_68->length == 7) {
      uVar1 = ntohs(*(uint16_t *)(pbVar2 + 5));
      *port = uVar1;
    }
    else {
      *port = 0x356;
    }
    addr_local._4_4_ = netaddr_from_binary_prefix(addr,pbVar2 + 1,4,2,0xff);
  }
  else {
    addr_local._4_4_ = -1;
  }
  return addr_local._4_4_;
}

Assistant:

int
dlep_reader_ipv4_conpoint_tlv(
  struct netaddr *addr, uint16_t *port, bool *tls, struct dlep_session *session, struct dlep_parser_value *value) {
  uint16_t tmp;
  const uint8_t *ptr;

  if (!value) {
    value = dlep_session_get_tlv_value(session, DLEP_IPV4_CONPOINT_TLV);
    if (!value) {
      return -1;
    }
  }

  if (value->length != 5 && value->length != 7) {
    return -1;
  }

  ptr = dlep_session_get_tlv_binary(session, value);

  /* handle TLS flag */
  *tls = (ptr[0] & DLEP_CONNECTION_TLS) == DLEP_CONNECTION_TLS;

  /* handle port */
  if (value->length == 7) {
    memcpy(&tmp, &ptr[5], sizeof(tmp));
    *port = ntohs(tmp);
  }
  else {
    *port = DLEP_PORT;
  }

  /* handle IP */
  return netaddr_from_binary(addr, &ptr[1], 4, AF_INET);
}